

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

void mnist_model_build(mnist_model *model)

{
  bool bVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ggml_context *pgVar11;
  undefined4 uVar12;
  undefined1 auStack_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_68;
  undefined4 uStack_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_48;
  undefined8 uStack_40;
  mnist_model *pmStack_38;
  
  bVar1 = std::operator==(&model->arch,"mnist-fc");
  if (bVar1) {
    ggml_set_param(model->ctx_compute,model->fc1_weight);
    ggml_set_param(model->ctx_compute,model->fc1_bias);
    ggml_set_param(model->ctx_compute,model->fc2_weight);
    ggml_set_param(model->ctx_compute,model->fc2_bias);
    pgVar11 = model->ctx_compute;
    uVar2 = ggml_mul_mat(pgVar11,model->fc1_weight,model->images);
    uVar2 = ggml_add(pgVar11,uVar2,model->fc1_bias);
    uVar2 = ggml_relu(pgVar11,uVar2);
    pgVar11 = model->ctx_compute;
    uVar2 = ggml_mul_mat(pgVar11,model->fc2_weight,uVar2);
    pgVar3 = model->fc2_bias;
  }
  else {
    bVar1 = std::operator==(&model->arch,"mnist-cnn");
    if (!bVar1) {
      pcVar9 = "false";
      uVar2 = 0x174;
      goto LAB_001066fb;
    }
    ggml_set_param(model->ctx_compute,model->conv1_kernel);
    ggml_set_param(model->ctx_compute,model->conv1_bias);
    ggml_set_param(model->ctx_compute,model->conv2_kernel);
    ggml_set_param(model->ctx_compute,model->conv2_bias);
    ggml_set_param(model->ctx_compute,model->dense_weight);
    ggml_set_param(model->ctx_compute,model->dense_bias);
    uVar2 = ggml_reshape_4d(model->ctx_compute,model->images,0x1c,0x1c,1,model->images->ne[1]);
    pgVar11 = model->ctx_compute;
    pmStack_38 = (mnist_model *)0x1;
    uStack_40 = 0x10617f;
    uVar2 = ggml_conv_2d(pgVar11,model->conv1_kernel,uVar2,1,1,1);
    uVar2 = ggml_add(pgVar11,uVar2,model->conv1_bias);
    lVar6 = ggml_relu(pgVar11,uVar2);
    if (*(long *)(lVar6 + 0x10) != 0x1c) {
      pcVar9 = "conv1_out->ne[0] == MNIST_HW";
      uVar2 = 0x151;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x18) != 0x1c) {
      pcVar9 = "conv1_out->ne[1] == MNIST_HW";
      uVar2 = 0x152;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x20) != 8) {
      pcVar9 = "conv1_out->ne[2] == MNIST_CNN_NCB";
      uVar2 = 0x153;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x28) != (long)model->nbatch_physical) {
      pcVar9 = "conv1_out->ne[3] == model.nbatch_physical";
      uVar2 = 0x154;
      goto LAB_001066fb;
    }
    lVar6 = ggml_pool_2d(0,0,model->ctx_compute,lVar6,0,2,2,2);
    if (*(long *)(lVar6 + 0x10) != 0xe) {
      pcVar9 = "conv2_in->ne[0] == MNIST_HW/2";
      uVar2 = 0x157;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x18) != 0xe) {
      pcVar9 = "conv2_in->ne[1] == MNIST_HW/2";
      uVar2 = 0x158;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x20) != 8) {
      pcVar9 = "conv2_in->ne[2] == MNIST_CNN_NCB";
      uVar2 = 0x159;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x28) != (long)model->nbatch_physical) {
      pcVar9 = "conv2_in->ne[3] == model.nbatch_physical";
      uVar2 = 0x15a;
      goto LAB_001066fb;
    }
    pgVar11 = model->ctx_compute;
    pmStack_38 = (mnist_model *)0x1;
    uStack_40 = 0x106254;
    uVar2 = ggml_conv_2d(pgVar11,model->conv2_kernel,lVar6,1,1,1);
    uVar2 = ggml_add(pgVar11,uVar2,model->conv2_bias);
    lVar6 = ggml_relu(pgVar11,uVar2);
    if (*(long *)(lVar6 + 0x10) != 0xe) {
      pcVar9 = "conv2_out->ne[0] == MNIST_HW/2";
      uVar2 = 0x15f;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x18) != 0xe) {
      pcVar9 = "conv2_out->ne[1] == MNIST_HW/2";
      uVar2 = 0x160;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x20) != 0x10) {
      pcVar9 = "conv2_out->ne[2] == MNIST_CNN_NCB*2";
      uVar2 = 0x161;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x28) != (long)model->nbatch_physical) {
      pcVar9 = "conv2_out->ne[3] == model.nbatch_physical";
      uVar2 = 0x162;
      goto LAB_001066fb;
    }
    lVar6 = ggml_pool_2d(0,0,model->ctx_compute,lVar6,0,2,2,2);
    if (*(long *)(lVar6 + 0x10) != 7) {
      pcVar9 = "dense_in->ne[0] == MNIST_HW/4";
      uVar2 = 0x165;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x18) != 7) {
      pcVar9 = "dense_in->ne[1] == MNIST_HW/4";
      uVar2 = 0x166;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x20) != 0x10) {
      pcVar9 = "dense_in->ne[2] == MNIST_CNN_NCB*2";
      uVar2 = 0x167;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x28) != (long)model->nbatch_physical) {
      pcVar9 = "dense_in->ne[3] == model.nbatch_physical";
      uVar2 = 0x168;
      goto LAB_001066fb;
    }
    pgVar11 = model->ctx_compute;
    uVar2 = ggml_permute(pgVar11,lVar6,1,2,0,3);
    uVar2 = ggml_cont(pgVar11,uVar2);
    lVar6 = ggml_reshape_2d(pgVar11,uVar2,0x310,(long)model->nbatch_physical);
    if (*(long *)(lVar6 + 0x10) != 0x310) {
      pcVar9 = "dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2)";
      uVar2 = 0x16d;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x18) != (long)model->nbatch_physical) {
      pcVar9 = "dense_in->ne[1] == model.nbatch_physical";
      uVar2 = 0x16e;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x20) != 1) {
      pcVar9 = "dense_in->ne[2] == 1";
      uVar2 = 0x16f;
      goto LAB_001066fb;
    }
    if (*(long *)(lVar6 + 0x28) != 1) {
      pcVar9 = "dense_in->ne[3] == 1";
      uVar2 = 0x170;
      goto LAB_001066fb;
    }
    pgVar11 = model->ctx_compute;
    uVar2 = ggml_mul_mat(pgVar11,model->dense_weight,lVar6);
    pgVar3 = model->dense_bias;
  }
  pgVar3 = (ggml_tensor *)ggml_add(pgVar11,uVar2,pgVar3);
  model->logits = pgVar3;
  ggml_set_name(pgVar3,"logits");
  ggml_set_output(model->logits);
  pgVar3 = model->logits;
  if (pgVar3->type == GGML_TYPE_F32) {
    if (pgVar3->ne[0] == 10) {
      if (pgVar3->ne[1] == (long)model->nbatch_physical) {
        if (pgVar3->ne[2] == 1) {
          if (pgVar3->ne[3] == 1) {
            return;
          }
          pcVar9 = "model.logits->ne[3] == 1";
          uVar2 = 0x17d;
        }
        else {
          pcVar9 = "model.logits->ne[2] == 1";
          uVar2 = 0x17c;
        }
      }
      else {
        pcVar9 = "model.logits->ne[1] == model.nbatch_physical";
        uVar2 = 0x17b;
      }
    }
    else {
      pcVar9 = "model.logits->ne[0] == MNIST_NCLASSES";
      uVar2 = 0x17a;
    }
  }
  else {
    pcVar9 = "model.logits->type == GGML_TYPE_F32";
    uVar2 = 0x179;
  }
LAB_001066fb:
  pcVar10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
  ;
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
             ,uVar2,"GGML_ASSERT(%s) failed",pcVar9);
  pmStack_38 = model;
  uVar4 = ggml_opt_result_init();
  ggml_opt_default_params
            (auStack_78,*(undefined8 *)(pcVar10 + 0x20),*(undefined8 *)(pcVar10 + 0xb8),
             *(undefined8 *)(pcVar10 + 0x48),*(undefined8 *)(pcVar10 + 0x50),2);
  uStack_54 = 0;
  uVar12 = (undefined4)uStack_40;
  uVar5 = ggml_opt_init();
  lVar6 = ggml_time_us();
  ggml_opt_epoch(uVar5,uVar2,0,uVar4,0,0,0,uStack_70,uStack_68,uStack_60,uStack_58,uStack_50,
                 uStack_48,uVar12);
  lVar7 = ggml_time_us();
  lVar8 = ggml_opt_dataset_data(uVar2);
  fprintf(_stderr,"%s: model evaluation on %d images took %.2lf ms, %.2lf us/image\n",
          SUB84((double)(lVar7 - lVar6) * 0.001,0),
          SUB84((double)(lVar7 - lVar6) / (double)*(int *)(lVar8 + 0x18),0),"mnist_model_eval");
  ggml_opt_free(uVar5);
  return;
}

Assistant:

void mnist_model_build(mnist_model & model) {
    if (model.arch == "mnist-fc") {
        ggml_set_param(model.ctx_compute, model.fc1_weight);
        ggml_set_param(model.ctx_compute, model.fc1_bias);
        ggml_set_param(model.ctx_compute, model.fc2_weight);
        ggml_set_param(model.ctx_compute, model.fc2_bias);

        ggml_tensor * fc1 = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc1_weight, model.images),
            model.fc1_bias));
        model.logits = ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc2_weight, fc1),
            model.fc2_bias);
    } else if (model.arch == "mnist-cnn") {
        ggml_set_param(model.ctx_compute, model.conv1_kernel);
        ggml_set_param(model.ctx_compute, model.conv1_bias);
        ggml_set_param(model.ctx_compute, model.conv2_kernel);
        ggml_set_param(model.ctx_compute, model.conv2_bias);
        ggml_set_param(model.ctx_compute, model.dense_weight);
        ggml_set_param(model.ctx_compute, model.dense_bias);

        struct ggml_tensor * images_2D = ggml_reshape_4d(model.ctx_compute, model.images, MNIST_HW, MNIST_HW, 1, model.images->ne[1]);

        struct ggml_tensor * conv1_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv1_kernel, images_2D, 1, 1, 1, 1, 1, 1),
            model.conv1_bias));
        GGML_ASSERT(conv1_out->ne[0] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[1] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv1_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_in = ggml_pool_2d(model.ctx_compute, conv1_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(conv2_in->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv2_in->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv2_kernel, conv2_in, 1, 1, 1, 1, 1, 1),
            model.conv2_bias));
        GGML_ASSERT(conv2_out->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(conv2_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * dense_in = ggml_pool_2d(model.ctx_compute, conv2_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(dense_in->ne[0] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[1] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(dense_in->ne[3] == model.nbatch_physical);

        dense_in = ggml_reshape_2d(model.ctx_compute,
            ggml_cont(model.ctx_compute, ggml_permute(model.ctx_compute, dense_in, 1, 2, 0, 3)),
            (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2), model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2));
        GGML_ASSERT(dense_in->ne[1] == model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[2] == 1);
        GGML_ASSERT(dense_in->ne[3] == 1);

        model.logits = ggml_add(model.ctx_compute, ggml_mul_mat(model.ctx_compute, model.dense_weight, dense_in), model.dense_bias);
    } else {
        GGML_ASSERT(false);
    }

    ggml_set_name(model.logits, "logits");
    ggml_set_output(model.logits);
    GGML_ASSERT(model.logits->type == GGML_TYPE_F32);
    GGML_ASSERT(model.logits->ne[0] == MNIST_NCLASSES);
    GGML_ASSERT(model.logits->ne[1] == model.nbatch_physical);
    GGML_ASSERT(model.logits->ne[2] == 1);
    GGML_ASSERT(model.logits->ne[3] == 1);
}